

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBar.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementBar::ComputeInternalForces(ChElementBar *this,ChVectorDynamic<> *Fi)

{
  pointer psVar1;
  element_type *peVar2;
  element_type *peVar3;
  double dVar4;
  ChVector<double> *local_d8 [2];
  ChVector<double> v;
  double local_88;
  double dStack_80;
  double local_78;
  ChVector<double> v_1;
  ChVector<double> dir;
  
  if ((Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows == 6) {
    psVar1 = (this->nodes).
             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    peVar2 = (psVar1->super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    peVar3 = psVar1[1].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    v.m_data._0_16_ =
         vsubpd_avx(*(undefined1 (*) [16])&(peVar3->super_ChNodeFEAbase).field_0x20,
                    *(undefined1 (*) [16])&(peVar2->super_ChNodeFEAbase).field_0x20);
    dVar4 = *(double *)&peVar3->field_0x30 - *(double *)&peVar2->field_0x30;
    v.m_data[2] = dVar4;
    ChVector<double>::GetNormalized(&dir,&v);
    (*(this->super_ChElementGeneric).super_ChElementBase._vptr_ChElementBase[0x17])(this);
    local_d8[0] = &v_1;
    v_1.m_data[0] = dVar4 * dir.m_data[0];
    v_1.m_data[1] = dVar4 * dir.m_data[1];
    local_88 = dVar4 * -dir.m_data[0];
    dStack_80 = dVar4 * -dir.m_data[1];
    v_1.m_data[2] = dVar4 * dir.m_data[2];
    local_78 = dVar4 * -dir.m_data[2];
    Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&v,Fi,0,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
              ((Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *)&v,
               (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)local_d8);
    local_d8[0] = (ChVector<double> *)&local_88;
    Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&v,Fi,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
              ((Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *)&v,
               (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)local_d8);
    return;
  }
  __assert_fail("Fi.size() == 6",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementBar.cpp"
                ,0x5e,
                "virtual void chrono::fea::ChElementBar::ComputeInternalForces(ChVectorDynamic<> &)"
               );
}

Assistant:

void ChElementBar::ComputeInternalForces(ChVectorDynamic<>& Fi) {
    assert(Fi.size() == 6);

	ChVector<> dir = (nodes[1]->GetPos() - nodes[0]->GetPos()).GetNormalized();
	double internal_force_local = GetCurrentForce();
    ChVector<> int_forceA = dir * internal_force_local;
    ChVector<> int_forceB = -dir * internal_force_local;

    Fi.segment(0, 3) = int_forceA.eigen();
    Fi.segment(3, 3) = int_forceB.eigen();
}